

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

void Lf_ManSetMapRefsOne(Lf_Man_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  Lf_Bst_t *pBest_00;
  Lf_Cut_t *pCut_00;
  Gia_Obj_t *pObj;
  float fVar3;
  bool local_35;
  int Required;
  int Index;
  int k;
  Lf_Bst_t *pBest;
  Lf_Cut_t *pCut;
  int iObj_local;
  Lf_Man_t *p_local;
  
  pBest_00 = Lf_ObjReadBest(p,iObj);
  iVar1 = Lf_ObjRequired(p,iObj);
  iVar2 = Lf_ObjMapRefNum(p,iObj);
  if (iVar2 < 1) {
    __assert_fail("Lf_ObjMapRefNum(p, iObj) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                  ,0x5aa,"void Lf_ManSetMapRefsOne(Lf_Man_t *, int)");
  }
  if ((((uint)pBest_00->Cut[0] & 1) != 0) || (((uint)pBest_00->Cut[1] & 1) != 0)) {
    __assert_fail("!pBest->Cut[0].fUsed && !pBest->Cut[1].fUsed",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                  ,0x5ab,"void Lf_ManSetMapRefsOne(Lf_Man_t *, int)");
  }
  if (p->pPars->fUseMux7 != 0) {
    iVar2 = Lf_ManSetMuxCut(p,pBest_00,iObj,iVar1);
    if (iVar2 != 0) goto LAB_0095ed7b;
  }
  iVar2 = Lf_BestDiffCuts(pBest_00);
  local_35 = false;
  if (iVar2 != 0) {
    local_35 = pBest_00->Delay[1] <= iVar1;
  }
  pBest_00->Cut[(int)(uint)local_35] =
       (Lf_Plc_t)((uint)pBest_00->Cut[(int)(uint)local_35] & 0xfffffffe | 1);
LAB_0095ed7b:
  pCut_00 = Lf_ObjCutBest(p,iObj);
  if (((*(uint *)&pCut_00->field_0x14 >> 0x17 & 1) != 0) &&
     (*(uint *)&pCut_00->field_0x14 >> 0x18 != 3)) {
    __assert_fail("!pCut->fMux7 || pCut->nLeaves == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                  ,0x5b2,"void Lf_ManSetMapRefsOne(Lf_Man_t *, int)");
  }
  for (Required = 0; Required < (int)(*(uint *)&pCut_00->field_0x14 >> 0x18);
      Required = Required + 1) {
    Lf_ObjSetRequired(p,*(int *)((long)&pCut_00[1].Sign + (long)Required * 4),iVar1 + -1);
    pObj = Gia_ManObj(p->pGia,*(int *)((long)&pCut_00[1].Sign + (long)Required * 4));
    iVar2 = Gia_ObjIsAndNotBuf(pObj);
    if (iVar2 != 0) {
      Lf_ObjMapRefInc(p,*(int *)((long)&pCut_00[1].Sign + (long)Required * 4));
    }
  }
  if ((*(uint *)&pCut_00->field_0x14 >> 0x17 & 1) == 0) {
    iVar1 = Vec_FltSize(&p->vSwitches);
    if (iVar1 != 0) {
      fVar3 = Lf_CutSwitches(p,pCut_00);
      p->Switches = (double)fVar3 + p->Switches;
    }
    p->pPars->Edge = (ulong)(*(uint *)&pCut_00->field_0x14 >> 0x18) + p->pPars->Edge;
    p->pPars->Area = p->pPars->Area + 1;
  }
  else {
    p->pPars->Mux7 = p->pPars->Mux7 + 1;
    p->pPars->Edge = p->pPars->Edge + 1;
  }
  return;
}

Assistant:

void Lf_ManSetMapRefsOne( Lf_Man_t * p, int iObj )
{
    Lf_Cut_t * pCut;
    Lf_Bst_t * pBest = Lf_ObjReadBest( p, iObj );
    int k, Index, Required = Lf_ObjRequired( p, iObj );
    assert( Lf_ObjMapRefNum(p, iObj) > 0 );
    assert( !pBest->Cut[0].fUsed && !pBest->Cut[1].fUsed );
    if ( !p->pPars->fUseMux7 || !Lf_ManSetMuxCut(p, pBest, iObj, Required) )
    {
        Index = (int)(Lf_BestDiffCuts(pBest) && pBest->Delay[1] <= Required);
        pBest->Cut[Index].fUsed = 1;
    }
    pCut = Lf_ObjCutBest( p, iObj );
    assert( !pCut->fMux7 || pCut->nLeaves == 3 );
//    assert( pCut->Delay <= Required );
    for ( k = 0; k < (int)pCut->nLeaves; k++ )
    {
//        if ( pCut->fMux7 && pCut->pLeaves[k] != Gia_ObjFaninId2(p->pGia, iObj) )
//            Lf_ObjSetRequired( p, pCut->pLeaves[k], Required );
//        else
            Lf_ObjSetRequired( p, pCut->pLeaves[k], Required - 1 );
        if ( Gia_ObjIsAndNotBuf(Gia_ManObj(p->pGia, pCut->pLeaves[k])) )
            Lf_ObjMapRefInc( p, pCut->pLeaves[k] );
    }
    if ( pCut->fMux7 )
    {
        p->pPars->Mux7++;
        p->pPars->Edge++;
        return;
    }
    if ( Vec_FltSize(&p->vSwitches) )
        p->Switches += Lf_CutSwitches(p, pCut);
    p->pPars->Edge += pCut->nLeaves;
    p->pPars->Area++;
}